

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

uint get_bits_MSB(cram_block *block,int nbits)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  byte bVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  
  uVar8 = block->bit;
  if (nbits <= (int)(uVar8 + 1)) {
    bVar1 = block->data[block->byte];
    iVar7 = uVar8 - nbits;
    block->bit = iVar7;
    if (iVar7 == -1) {
      block->bit = 7;
      block->byte = block->byte + 1;
    }
    return ~(-1 << ((byte)nbits & 0x1f)) & (uint)(bVar1 >> ((char)iVar7 + 1U & 0x1f));
  }
  switch(nbits) {
  case 1:
    puVar4 = block->data;
    sVar6 = block->byte;
    uVar3 = 0;
    goto LAB_0014540f;
  case 2:
    puVar4 = block->data;
    sVar6 = block->byte;
    uVar3 = 0;
    goto LAB_001453e4;
  case 3:
    puVar4 = block->data;
    sVar6 = block->byte;
    uVar3 = 0;
    goto LAB_001453b8;
  case 4:
    puVar4 = block->data;
    sVar6 = block->byte;
    uVar3 = 0;
    goto LAB_0014538d;
  case 5:
    puVar4 = block->data;
    sVar6 = block->byte;
    uVar3 = 0;
    goto LAB_00145361;
  case 6:
    puVar4 = block->data;
    sVar6 = block->byte;
    uVar3 = 0;
    goto LAB_00145336;
  case 7:
    puVar4 = block->data;
    sVar6 = block->byte;
    uVar3 = 0;
    break;
  case 8:
    puVar4 = block->data;
    bVar1 = puVar4[block->byte];
    bVar5 = (byte)uVar8;
    sVar6 = (ulong)((int)uVar8 < 1) + block->byte;
    block->byte = sVar6;
    uVar8 = uVar8 - 1 & 7;
    block->bit = uVar8;
    uVar3 = (uint)(bVar1 >> (bVar5 & 0x1f)) * 2 & 2;
    break;
  default:
    uVar3 = 0;
    if (nbits < 1) {
      nbits = 0;
      uVar3 = 0;
    }
    while (bVar9 = nbits != 0, nbits = nbits + -1, bVar9) {
      uVar3 = (uint)((block->data[block->byte] >> (uVar8 & 0x1f) & 1) != 0) + uVar3 * 2;
      block->byte = (ulong)((int)uVar8 < 1) + block->byte;
      uVar8 = uVar8 - 1 & 7;
      block->bit = uVar8;
    }
    return uVar3;
  }
  bVar1 = puVar4[sVar6];
  uVar2 = uVar8 & 0x1f;
  sVar6 = ((int)uVar8 < 1) + sVar6;
  block->byte = sVar6;
  uVar8 = uVar8 - 1 & 7;
  block->bit = uVar8;
  uVar3 = ((bVar1 >> uVar2 & 1) != 0 | uVar3) * 2;
LAB_00145336:
  bVar1 = puVar4[sVar6];
  uVar2 = uVar8 & 0x1f;
  sVar6 = ((int)uVar8 < 1) + sVar6;
  block->byte = sVar6;
  uVar8 = uVar8 - 1 & 7;
  block->bit = uVar8;
  uVar3 = ((bVar1 >> uVar2 & 1) != 0 | uVar3) * 2;
LAB_00145361:
  bVar1 = puVar4[sVar6];
  uVar2 = uVar8 & 0x1f;
  sVar6 = ((int)uVar8 < 1) + sVar6;
  block->byte = sVar6;
  uVar8 = uVar8 - 1 & 7;
  block->bit = uVar8;
  uVar3 = ((bVar1 >> uVar2 & 1) != 0 | uVar3) * 2;
LAB_0014538d:
  bVar1 = puVar4[sVar6];
  uVar2 = uVar8 & 0x1f;
  sVar6 = ((int)uVar8 < 1) + sVar6;
  block->byte = sVar6;
  uVar8 = uVar8 - 1 & 7;
  block->bit = uVar8;
  uVar3 = ((bVar1 >> uVar2 & 1) != 0 | uVar3) * 2;
LAB_001453b8:
  bVar1 = puVar4[sVar6];
  uVar2 = uVar8 & 0x1f;
  sVar6 = ((int)uVar8 < 1) + sVar6;
  block->byte = sVar6;
  uVar8 = uVar8 - 1 & 7;
  block->bit = uVar8;
  uVar3 = ((bVar1 >> uVar2 & 1) != 0 | uVar3) * 2;
LAB_001453e4:
  bVar1 = puVar4[sVar6];
  uVar2 = uVar8 & 0x1f;
  sVar6 = ((int)uVar8 < 1) + sVar6;
  block->byte = sVar6;
  uVar8 = uVar8 - 1 & 7;
  block->bit = uVar8;
  uVar3 = ((bVar1 >> uVar2 & 1) != 0 | uVar3) * 2;
LAB_0014540f:
  bVar1 = puVar4[sVar6];
  block->byte = ((int)uVar8 < 1) + sVar6;
  block->bit = uVar8 - 1 & 7;
  return (bVar1 >> (uVar8 & 0x1f) & 1) != 0 | uVar3;
}

Assistant:

static inline unsigned int get_bits_MSB(cram_block *block, int nbits) {
    unsigned int val = 0;
    int i;

#if 0
    // Fits within the current byte */
    if (nbits <= block->bit+1) {
	val = (block->data[block->byte]>>(block->bit-(nbits-1))) & ((1<<nbits)-1);
	if ((block->bit -= nbits) == -1) {
	    block->bit = 7;
	    block->byte++;
	}
	return val;
    }

    // partial first byte
    val = block->data[block->byte] & ((1<<(block->bit+1))-1);
    nbits -= block->bit+1;
    block->bit = 7;
    block->byte++;

    // whole middle bytes
    while (nbits >= 8) {
	val = (val << 8) | block->data[block->byte++];
	nbits -= 8;
    }

    val <<= nbits;
    val |= (block->data[block->byte]>>(block->bit-(nbits-1))) & ((1<<nbits)-1);
    block->bit -= nbits;
    return val;
#endif

#if 0
    /* Inefficient implementation! */
    //printf("{");
    for (i = 0; i < nbits; i++)
	//val = (val << 1) | get_bit_MSB(block);
	GET_BIT_MSB(block, val);
#endif

#if 1
    /* Combination of 1st two methods */
    if (nbits <= block->bit+1) {
	val = (block->data[block->byte]>>(block->bit-(nbits-1))) & ((1<<nbits)-1);
	if ((block->bit -= nbits) == -1) {
	    block->bit = 7;
	    block->byte++;
	}
	return val;
    }

    switch(nbits) {
//    case 15: GET_BIT_MSB(block, val);
//    case 14: GET_BIT_MSB(block, val);
//    case 13: GET_BIT_MSB(block, val);
//    case 12: GET_BIT_MSB(block, val);
//    case 11: GET_BIT_MSB(block, val);
//    case 10: GET_BIT_MSB(block, val);
//    case  9: GET_BIT_MSB(block, val);
    case  8: GET_BIT_MSB(block, val);
    case  7: GET_BIT_MSB(block, val);
    case  6: GET_BIT_MSB(block, val);
    case  5: GET_BIT_MSB(block, val);
    case  4: GET_BIT_MSB(block, val);
    case  3: GET_BIT_MSB(block, val);
    case  2: GET_BIT_MSB(block, val);
    case  1: GET_BIT_MSB(block, val);
	break;

    default:
	for (i = 0; i < nbits; i++)
	    //val = (val << 1) | get_bit_MSB(block);
	    GET_BIT_MSB(block, val);
    }
#endif

    //printf("=0x%x}", val);

    return val;
}